

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void write_frm_crc(FILE *fp,FrmCrc *crc)

{
  ulong uVar1;
  
  if (fp != (FILE *)0x0) {
    fprintf((FILE *)fp,"%d,",(ulong)(crc->luma).len);
    if ((crc->luma).sum_cnt != 0) {
      uVar1 = 0;
      do {
        fprintf((FILE *)fp," %lx,",(crc->luma).sum[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (crc->luma).sum_cnt);
    }
    fprintf((FILE *)fp," %08x,",(ulong)(crc->luma).vor);
    fprintf((FILE *)fp," %d,",(ulong)(crc->chroma).len);
    if ((crc->chroma).sum_cnt != 0) {
      uVar1 = 0;
      do {
        fprintf((FILE *)fp," %lx,",(crc->chroma).sum[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (crc->chroma).sum_cnt);
    }
    fprintf((FILE *)fp," %08x\n",(ulong)(crc->chroma).vor);
    fflush((FILE *)fp);
    return;
  }
  return;
}

Assistant:

void write_frm_crc(FILE *fp, FrmCrc *crc)
{
    RK_U32 loop = 0;

    if (fp) {
        // luma
        fprintf(fp, "%d,", crc->luma.len);
        for (loop = 0; loop < crc->luma.sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->luma.sum[loop]);
        }
        fprintf(fp, " %08x,", crc->luma.vor);

        // chroma
        fprintf(fp, " %d,", crc->chroma.len);
        for (loop = 0; loop < crc->chroma.sum_cnt; loop++) {
            fprintf(fp, " %lx,", crc->chroma.sum[loop]);
        }
        fprintf(fp, " %08x\n", crc->chroma.vor);

        fflush(fp);
    }
}